

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

SVInt slang::SVInt::createFillZ(bitwidth_t bitWidth,bool isSigned)

{
  undefined8 extraout_RDX;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 in_RDI;
  SVInt SVar1;
  SVInt *result;
  SVInt *in_stack_ffffffffffffffe0;
  
  allocUninitialized((bitwidth_t)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0),
                     SUB81((ulong)in_RDI >> 0x10,0));
  setAllZ(in_stack_ffffffffffffffe0);
  SVar1.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar1.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar1.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar1.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar1.super_SVIntStorage.field_0.val = in_RDI.val;
  return (SVInt)SVar1.super_SVIntStorage;
}

Assistant:

SVInt SVInt::createFillZ(bitwidth_t bitWidth, bool isSigned) {
    SVInt result = SVInt::allocUninitialized(bitWidth, isSigned, true);
    result.setAllZ();
    return result;
}